

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.cpp
# Opt level: O2

bool __thiscall
Potassco::ProgramOptions::Value::parse(Value *this,string *name,string *value,State st)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  allocator local_49;
  string local_48 [32];
  
  if ((value->_M_string_length == 0) && ((this->flags_ & 1) != 0)) {
    pcVar3 = implicit(this);
    std::__cxx11::string::string(local_48,pcVar3,&local_49);
    iVar2 = (*this->_vptr_Value[2])(this,name,local_48);
    cVar1 = (char)iVar2;
    if (cVar1 != '\0') {
      this->state_ = (byte_t)st;
    }
    std::__cxx11::string::~string(local_48);
  }
  else {
    iVar2 = (*this->_vptr_Value[2])(this,name);
    if ((char)iVar2 == '\0') {
      cVar1 = '\0';
    }
    else {
      this->state_ = (byte_t)st;
      cVar1 = '\x01';
    }
  }
  return (bool)cVar1;
}

Assistant:

bool Value::parse(const std::string& name, const std::string& value, State st) {
	if (!value.empty() || !isImplicit()) return state(doParse(name, value), st);
	const char* x = implicit();
	assert(x);
	return state(doParse(name, x), st);
}